

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

bool embree::sse2::FlatLinearCurveMiIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  ulong uVar17;
  Scene *scene;
  float fVar18;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar19 [16];
  float fVar23;
  float fVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  int local_1b4;
  RayQueryContext *local_1b0;
  float local_1a8;
  int iStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float local_184;
  float local_180;
  undefined4 local_17c;
  undefined4 local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  RTCFilterFunctionNArguments local_158;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8 [4];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [4];
  float local_68 [4];
  float local_58 [4];
  float local_48 [6];
  
  pSVar8 = context->scene;
  local_a8[0] = line->sharedGeomID;
  uVar4 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[local_a8[0]].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  pfVar1 = (float *)(lVar10 + (ulong)uVar4 * (long)p_Var11);
  local_118 = *pfVar1;
  local_f8 = pfVar1[1];
  local_108 = pfVar1[2];
  local_c8 = pfVar1[3];
  uVar5 = (line->v0).field_0.i[1];
  pfVar1 = (float *)(lVar10 + (ulong)uVar5 * (long)p_Var11);
  fStack_114 = *pfVar1;
  fStack_f4 = pfVar1[1];
  fStack_104 = pfVar1[2];
  fStack_c4 = pfVar1[3];
  uVar6 = (line->v0).field_0.i[2];
  pfVar1 = (float *)(lVar10 + (ulong)uVar6 * (long)p_Var11);
  fStack_110 = *pfVar1;
  fStack_f0 = pfVar1[1];
  fStack_100 = pfVar1[2];
  fStack_c0 = pfVar1[3];
  uVar7 = (line->v0).field_0.i[3];
  pfVar1 = (float *)(lVar10 + (ulong)uVar7 * (long)p_Var11);
  fStack_10c = *pfVar1;
  fStack_ec = pfVar1[1];
  fStack_fc = pfVar1[2];
  fStack_bc = pfVar1[3];
  pfVar1 = (float *)(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  local_198 = pfVar1[1];
  fVar13 = pfVar1[2];
  pfVar2 = (float *)(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  fStack_194 = pfVar2[1];
  fVar14 = pfVar2[2];
  lVar3 = lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11;
  fStack_190 = *(float *)(lVar3 + 4);
  lVar10 = lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11;
  fStack_18c = *(float *)(lVar10 + 4);
  local_128 = CONCAT44(fVar14,fVar13);
  local_b8 = -(uint)((line->primIDs).field_0.i[0] == 0xffffffff);
  uStack_b4 = -(uint)((line->primIDs).field_0.i[1] == 0xffffffff);
  uStack_b0 = -(uint)((line->primIDs).field_0.i[2] == 0xffffffff);
  uStack_ac = -(uint)((line->primIDs).field_0.i[3] == 0xffffffff);
  local_a8[1] = local_a8[0];
  local_a8[2] = local_a8[0];
  local_a8[3] = local_a8[0];
  fVar23 = (pre->ray_space).vy.field_0.m128[0];
  fVar27 = (pre->ray_space).vy.field_0.m128[1];
  local_e8 = (pre->ray_space).vy.field_0.m128[2];
  fVar33 = (pre->ray_space).vz.field_0.m128[0];
  fVar34 = (pre->ray_space).vz.field_0.m128[1];
  fVar35 = (pre->ray_space).vz.field_0.m128[2];
  fVar40 = (ray->org).field_0.m128[0];
  local_d8 = (ray->org).field_0.m128[1];
  fVar53 = (ray->org).field_0.m128[2];
  fVar36 = local_f8 - local_d8;
  fVar37 = fStack_f4 - local_d8;
  fVar38 = fStack_f0 - local_d8;
  fVar39 = fStack_ec - local_d8;
  fVar18 = local_108 - fVar53;
  fVar20 = fStack_104 - fVar53;
  fVar21 = fStack_100 - fVar53;
  fVar22 = fStack_fc - fVar53;
  fVar41 = (pre->ray_space).vx.field_0.m128[0];
  fVar43 = (pre->ray_space).vx.field_0.m128[1];
  fVar15 = (pre->ray_space).vx.field_0.m128[2];
  fVar44 = local_118 - fVar40;
  fVar45 = fStack_114 - fVar40;
  fVar46 = fStack_110 - fVar40;
  fVar47 = fStack_10c - fVar40;
  fVar55 = fVar41 * fVar44 + fVar23 * fVar36 + fVar33 * fVar18;
  fVar56 = fVar41 * fVar45 + fVar23 * fVar37 + fVar33 * fVar20;
  fVar57 = fVar41 * fVar46 + fVar23 * fVar38 + fVar33 * fVar21;
  fVar58 = fVar41 * fVar47 + fVar23 * fVar39 + fVar33 * fVar22;
  fVar29 = fVar43 * fVar44 + fVar27 * fVar36 + fVar34 * fVar18;
  fVar30 = fVar43 * fVar45 + fVar27 * fVar37 + fVar34 * fVar20;
  fVar31 = fVar43 * fVar46 + fVar27 * fVar38 + fVar34 * fVar21;
  fVar32 = fVar43 * fVar47 + fVar27 * fVar39 + fVar34 * fVar22;
  local_78[0] = fVar44 * fVar15 + fVar36 * local_e8 + fVar18 * fVar35;
  local_78[1] = fVar45 * fVar15 + fVar37 * local_e8 + fVar20 * fVar35;
  local_78[2] = fVar46 * fVar15 + fVar38 * local_e8 + fVar21 * fVar35;
  local_78[3] = fVar47 * fVar15 + fVar39 * local_e8 + fVar22 * fVar35;
  fVar36 = *pfVar1 - fVar40;
  fVar37 = *pfVar2 - fVar40;
  fVar38 = fStack_1a0 - fVar40;
  fVar40 = fStack_19c - fVar40;
  fVar18 = local_198 - local_d8;
  fVar20 = fStack_194 - local_d8;
  fVar21 = fStack_190 - local_d8;
  fVar22 = fStack_18c - local_d8;
  fVar48 = fVar13 - fVar53;
  fVar50 = fVar14 - fVar53;
  fVar51 = fStack_120 - fVar53;
  fVar53 = fStack_11c - fVar53;
  fVar39 = (fVar41 * fVar36 + fVar23 * fVar18 + fVar33 * fVar48) - fVar55;
  fVar44 = (fVar41 * fVar37 + fVar23 * fVar20 + fVar33 * fVar50) - fVar56;
  fVar45 = (fVar41 * fVar38 + fVar23 * fVar21 + fVar33 * fVar51) - fVar57;
  fVar41 = (fVar41 * fVar40 + fVar23 * fVar22 + fVar33 * fVar53) - fVar58;
  fVar46 = (fVar43 * fVar36 + fVar27 * fVar18 + fVar34 * fVar48) - fVar29;
  fVar47 = (fVar43 * fVar37 + fVar27 * fVar20 + fVar34 * fVar50) - fVar30;
  fVar42 = (fVar43 * fVar38 + fVar27 * fVar21 + fVar34 * fVar51) - fVar31;
  fVar43 = (fVar43 * fVar40 + fVar27 * fVar22 + fVar34 * fVar53) - fVar32;
  auVar24._0_4_ = fVar46 * fVar46;
  auVar24._4_4_ = fVar47 * fVar47;
  auVar24._8_4_ = fVar42 * fVar42;
  auVar24._12_4_ = fVar43 * fVar43;
  auVar28._0_4_ = fVar39 * fVar39 + auVar24._0_4_;
  auVar28._4_4_ = fVar44 * fVar44 + auVar24._4_4_;
  auVar28._8_4_ = fVar45 * fVar45 + auVar24._8_4_;
  auVar28._12_4_ = fVar41 * fVar41 + auVar24._12_4_;
  auVar25 = rcpps(auVar24,auVar28);
  fVar23 = auVar25._0_4_;
  fVar27 = auVar25._4_4_;
  fVar33 = auVar25._8_4_;
  fVar34 = auVar25._12_4_;
  auVar49._0_4_ =
       (((float)DAT_01f46a60 - auVar28._0_4_ * fVar23) * fVar23 + fVar23) *
       (-fVar29 * fVar46 - fVar55 * fVar39);
  auVar49._4_4_ =
       ((DAT_01f46a60._4_4_ - auVar28._4_4_ * fVar27) * fVar27 + fVar27) *
       (-fVar30 * fVar47 - fVar56 * fVar44);
  auVar49._8_4_ =
       ((DAT_01f46a60._8_4_ - auVar28._8_4_ * fVar33) * fVar33 + fVar33) *
       (-fVar31 * fVar42 - fVar57 * fVar45);
  auVar49._12_4_ =
       ((DAT_01f46a60._12_4_ - auVar28._12_4_ * fVar34) * fVar34 + fVar34) *
       (-fVar32 * fVar43 - fVar58 * fVar41);
  auVar25 = minps(auVar49,_DAT_01f46a60);
  auVar26._0_12_ = ZEXT812(0);
  auVar26._12_4_ = 0;
  local_98 = maxps(auVar25,auVar26);
  fVar23 = local_98._0_4_;
  fVar27 = local_98._4_4_;
  fVar52 = local_98._8_4_;
  fVar54 = local_98._12_4_;
  fVar55 = fVar39 * fVar23 + fVar55;
  fVar56 = fVar44 * fVar27 + fVar56;
  fVar57 = fVar45 * fVar52 + fVar57;
  fVar58 = fVar41 * fVar54 + fVar58;
  fVar29 = fVar46 * fVar23 + fVar29;
  fVar30 = fVar47 * fVar27 + fVar30;
  fVar31 = fVar42 * fVar52 + fVar31;
  fVar32 = fVar43 * fVar54 + fVar32;
  local_78[0] = ((fVar36 * fVar15 + fVar18 * local_e8 + fVar48 * fVar35) - local_78[0]) * fVar23 +
                local_78[0];
  local_78[1] = ((fVar37 * fVar15 + fVar20 * local_e8 + fVar50 * fVar35) - local_78[1]) * fVar27 +
                local_78[1];
  local_78[2] = ((fVar38 * fVar15 + fVar21 * local_e8 + fVar51 * fVar35) - local_78[2]) * fVar52 +
                local_78[2];
  local_78[3] = ((fVar40 * fVar15 + fVar22 * local_e8 + fVar53 * fVar35) - local_78[3]) * fVar54 +
                local_78[3];
  fVar33 = (pfVar1[3] - local_c8) * fVar23 + local_c8;
  fVar34 = (pfVar2[3] - fStack_c4) * fVar27 + fStack_c4;
  fVar35 = (*(float *)(lVar3 + 0xc) - fStack_c0) * fVar52 + fStack_c0;
  fVar40 = (*(float *)(lVar10 + 0xc) - fStack_bc) * fVar54 + fStack_bc;
  local_1a8 = ray->tfar;
  iStack_1a4 = ray->mask;
  fVar23 = (ray->org).field_0.m128[3];
  fVar27 = pre->depth_scale;
  auVar25._0_4_ =
       -(uint)((fVar33 + fVar33) * fVar27 < local_78[0]) &
       ~local_b8 & -(uint)(local_78[0] <= local_1a8 && fVar23 <= local_78[0]) &
       -(uint)(fVar55 * fVar55 + fVar29 * fVar29 <= fVar33 * fVar33);
  auVar25._4_4_ =
       -(uint)((fVar34 + fVar34) * fVar27 < local_78[1]) &
       ~uStack_b4 & -(uint)(local_78[1] <= local_1a8 && fVar23 <= local_78[1]) &
       -(uint)(fVar56 * fVar56 + fVar30 * fVar30 <= fVar34 * fVar34);
  auVar25._8_4_ =
       -(uint)((fVar35 + fVar35) * fVar27 < local_78[2]) &
       ~uStack_b0 & -(uint)(local_78[2] <= local_1a8 && fVar23 <= local_78[2]) &
       -(uint)(fVar57 * fVar57 + fVar31 * fVar31 <= fVar35 * fVar35);
  auVar25._12_4_ =
       -(uint)((fVar40 + fVar40) * fVar27 < local_78[3]) &
       ~uStack_ac & -(uint)(local_78[3] <= local_1a8 && fVar23 <= local_78[3]) &
       -(uint)(fVar58 * fVar58 + fVar32 * fVar32 <= fVar40 * fVar40);
  iVar16 = movmskps(local_a8[0],auVar25);
  if (iVar16 != 0) {
    local_68[0] = *pfVar1 - local_118;
    local_68[1] = *pfVar2 - fStack_114;
    auVar19._0_4_ =
         auVar25._0_4_ &
         -(uint)(fVar13 - local_108 != 0.0 || (local_198 - local_f8 != 0.0 || local_68[0] != 0.0));
    auVar19._4_4_ =
         auVar25._4_4_ &
         -(uint)(fVar14 - fStack_104 != 0.0 || (fStack_194 - fStack_f4 != 0.0 || local_68[1] != 0.0)
                );
    auVar19._8_4_ =
         auVar25._8_4_ &
         -(uint)(fStack_120 - fStack_100 != 0.0 ||
                (fStack_190 - fStack_f0 != 0.0 || fStack_1a0 - fStack_110 != 0.0));
    auVar19._12_4_ =
         auVar25._12_4_ &
         -(uint)(fStack_11c - fStack_fc != 0.0 ||
                (fStack_18c - fStack_ec != 0.0 || fStack_19c - fStack_10c != 0.0));
    iVar16 = movmskps(iVar16,auVar19);
    if (iVar16 != 0) {
      local_88 = 0;
      uStack_80 = 0;
      local_68[2] = fStack_1a0 - fStack_110;
      local_68[3] = fStack_19c - fStack_10c;
      local_58[0] = local_198 - local_f8;
      local_58[1] = fStack_194 - fStack_f4;
      local_58[2] = fStack_190 - fStack_f0;
      local_58[3] = fStack_18c - fStack_ec;
      local_48[0] = fVar13 - local_108;
      local_48[1] = fVar14 - fStack_104;
      local_48[2] = fStack_120 - fStack_100;
      local_48[3] = fStack_11c - fStack_fc;
      uVar17 = (ulong)(byte)iVar16;
      fStack_1a0 = (float)ray->id;
      fStack_19c = (float)ray->flags;
      local_1b0 = context;
      fStack_e4 = local_e8;
      fStack_e0 = local_e8;
      fStack_dc = local_e8;
      fStack_d4 = local_d8;
      fStack_d0 = local_d8;
      fStack_cc = local_d8;
      do {
        local_158.hit = (RTCHitN *)&local_188;
        local_158.valid = &local_1b4;
        uVar12 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        local_170 = local_a8[uVar12];
        pGVar9 = (pSVar8->geometries).items[local_170].ptr;
        if ((pGVar9->mask & ray->mask) != 0) {
          if ((local_1b0->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_17c = *(undefined4 *)(local_98 + uVar12 * 4);
          local_178 = *(undefined4 *)((long)&local_88 + uVar12 * 4);
          local_174 = (line->primIDs).field_0.i[uVar12];
          local_188 = local_68[uVar12];
          local_184 = local_58[uVar12];
          local_180 = local_48[uVar12];
          local_16c = local_1b0->user->instID[0];
          local_168 = local_1b0->user->instPrimID[0];
          ray->tfar = local_78[uVar12];
          local_1b4 = -1;
          local_158.geometryUserPtr = pGVar9->userPtr;
          local_158.context = local_1b0->user;
          local_158.N = 1;
          local_158.ray = (RTCRayN *)ray;
          if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar9->occlusionFilterN)(&local_158), *local_158.valid != 0)) {
            p_Var11 = local_1b0->args->filter;
            if ((p_Var11 == (RTCFilterFunctionN)0x0) ||
               ((((local_1b0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var11)(&local_158), *local_158.valid != 0)))) {
              return true;
            }
          }
          ray->tfar = local_1a8;
        }
        uVar17 = uVar17 ^ 1L << (uVar12 & 0x3f);
      } while (uVar17 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }